

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void log_ip(char *str,_sockaddr_in *addr)

{
  log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/main.c",
          0x8a,"%s %d:%d:%d:%d:port:%d ",str,(ulong)(byte)(addr->sin_addr).s_addr,
          (ulong)*(byte *)((long)&(addr->sin_addr).s_addr + 1),
          (ulong)*(byte *)((long)&(addr->sin_addr).s_addr + 2),
          (ulong)*(byte *)((long)&(addr->sin_addr).s_addr + 3),
          (ulong)(ushort)(addr->sin_port << 8 | addr->sin_port >> 8));
  return;
}

Assistant:

static inline void log_ip(const char* str,_sockaddr_in* addr){
    unsigned char* ipv4;
    #ifdef ACCEPT_IPV6_REQUEST
    WORD* ipv6;
    // if (*((unsigned long long*)&addr->sin6_addr) == 0){//如果前64位是0，说明是ipv4地址
    //   ipv4 = (unsigned char*)&addr->sin6_addr.u.Word[4];
    //   log_info("%s %d:%d:%d:%d:port:%d ",str,ipv4[0],ipv4[1],ipv4[2],ipv4[3],
    //       ntohs(addr->sin6_port));
    // }else{
      ipv6 = (uint16_t*)&addr->sin6_addr;//跨平台
      log_info("%s %04x:%04x:%04x:%04x:%04x:%04x:%04x:%04x port:%d ",str,
        ipv6[0],ipv6[1],ipv6[2],ipv6[3],ipv6[4],ipv6[5],ipv6[6],ipv6[7],ntohs(addr->sin6_port));
    // }
    #else
    ipv4 = (unsigned char*)&addr->sin_addr; //!不需要翻过来
    log_info("%s %d:%d:%d:%d:port:%d ",str,
              ipv4[0],ipv4[1],ipv4[2],ipv4[3],
              ntohs(addr->sin_port));
    #endif
}